

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

u_char * ngx_strstrn(u_char *s1,char *s2,size_t n)

{
  char cVar1;
  int iVar2;
  u_char *__s1;
  u_char c2;
  u_char c1;
  size_t n_local;
  char *s2_local;
  u_char *s1_local;
  
  cVar1 = *s2;
  __s1 = s1;
  do {
    s2_local = (char *)__s1;
    __s1 = (u_char *)(s2_local + 1);
    if (*s2_local == '\0') {
      return (u_char *)0x0;
    }
  } while ((*s2_local != cVar1) || (iVar2 = strncmp((char *)__s1,s2 + 1,n), iVar2 != 0));
  return (u_char *)s2_local;
}

Assistant:

u_char *
ngx_strstrn(u_char *s1, char *s2, size_t n)
{
    u_char  c1, c2;

    c2 = *(u_char *) s2++;

    do {
        do {
            c1 = *s1++;

            if (c1 == 0) {
                return NULL;
            }

        } while (c1 != c2);

    } while (ngx_strncmp(s1, (u_char *) s2, n) != 0);

    return --s1;
}